

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result spvc_compiler_require_extension(spvc_compiler compiler,char *line)

{
  CompilerGLSL *this;
  spvc_context_s *this_00;
  spvc_result sVar1;
  allocator local_49;
  string local_48;
  string local_28;
  
  if (compiler->backend == SPVC_BACKEND_NONE) {
    this_00 = compiler->context;
    std::__cxx11::string::string
              ((string *)&local_28,
               "Cross-compilation related option used on NONE backend which only supports reflection."
               ,(allocator *)&local_48);
    spvc_context_s::report_error(this_00,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    sVar1 = SPVC_ERROR_INVALID_ARGUMENT;
  }
  else {
    this = (CompilerGLSL *)
           (compiler->compiler)._M_t.
           super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
           .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_48,line,&local_49);
    spirv_cross::CompilerGLSL::require_extension(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    sVar1 = SPVC_SUCCESS;
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_require_extension(spvc_compiler compiler, const char *line)
{
#if SPIRV_CROSS_C_API_GLSL
	if (compiler->backend == SPVC_BACKEND_NONE)
	{
		compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	static_cast<CompilerGLSL *>(compiler->compiler.get())->require_extension(line);
	return SPVC_SUCCESS;
#else
	(void)line;
	compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}